

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tb.cc
# Opt level: O0

void __thiscall kratos::AssertValueStmt::AssertValueStmt(AssertValueStmt *this)

{
  undefined1 local_30 [32];
  AssertValueStmt *local_10;
  AssertValueStmt *this_local;
  
  local_10 = this;
  constant(0,1,false);
  Var::as<kratos::Const>((Var *)local_30);
  std::shared_ptr<kratos::Var>::shared_ptr<kratos::Const,void>
            ((shared_ptr<kratos::Var> *)(local_30 + 0x10),(shared_ptr<kratos::Const> *)local_30);
  AssertValueStmt(this,(shared_ptr<kratos::Var> *)(local_30 + 0x10));
  std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)(local_30 + 0x10));
  std::shared_ptr<kratos::Const>::~shared_ptr((shared_ptr<kratos::Const> *)local_30);
  return;
}

Assistant:

AssertValueStmt::AssertValueStmt() : AssertValueStmt(constant(0, 1).as<Const>()) {}